

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O1

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
_addValue<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *this,
          _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          I,RWNode *val,bool update)

{
  _Base_ptr *this_00;
  _Base_ptr *pp_Var1;
  byte bVar2;
  undefined7 in_register_00000009;
  _Base_ptr *pp_Var3;
  _Base_ptr *pp_Var4;
  pair<std::_Rb_tree_iterator<dg::dda::RWNode_*>,_bool> pVar5;
  RWNode *local_18;
  
  this_00 = &I._M_node[1]._M_left;
  local_18 = val;
  if ((int)CONCAT71(in_register_00000009,update) == 0) {
    pVar5 = std::
            _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
            ::_M_insert_unique<dg::dda::RWNode*const&>
                      ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                        *)this_00,&local_18);
    bVar2 = pVar5.second;
  }
  else {
    if (I._M_node[2]._M_right == (_Base_ptr)0x1) {
      pp_Var1 = &I._M_node[1]._M_right;
      pp_Var3 = pp_Var1;
      for (pp_Var4 = *(_Base_ptr **)(I._M_node + 2); pp_Var4 != (_Base_ptr *)0x0;
          pp_Var4 = (_Base_ptr *)pp_Var4[(ulong)((RWNode *)pp_Var4[4] < val) + 2]) {
        if ((RWNode *)pp_Var4[4] >= val) {
          pp_Var3 = pp_Var4;
        }
      }
      pp_Var4 = pp_Var1;
      if ((pp_Var3 != pp_Var1) && (pp_Var4 = pp_Var3, val < (RWNode *)pp_Var3[4])) {
        pp_Var4 = pp_Var1;
      }
      if (pp_Var4 != pp_Var1) {
        bVar2 = 0;
        goto LAB_00115633;
      }
    }
    std::
    _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
    ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                *)this_00,*(_Link_type *)(I._M_node + 2));
    *(undefined8 *)(I._M_node + 2) = 0;
    I._M_node[2]._M_parent = (_Base_ptr)&I._M_node[1]._M_right;
    I._M_node[2]._M_left = (_Base_ptr)&I._M_node[1]._M_right;
    I._M_node[2]._M_right = (_Base_ptr)0x0;
    std::
    _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
    ::_M_insert_unique<dg::dda::RWNode*const&>
              ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                *)this_00,&local_18);
    bVar2 = 1;
  }
LAB_00115633:
  return (bool)(bVar2 & 1);
}

Assistant:

bool _addValue(IteratorT I, ValueT val, bool update) {
        if (update) {
            if (I->second.size() == 1 && I->second.count(val) > 0)
                return false;

            I->second.clear();
            I->second.insert(val);
            return true;
        }

        return I->second.insert(val).second;
    }